

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase_no_destroy(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  bool bVar2;
  NodeBase *pNVar3;
  TableEntryPtr *pTVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 uVar7;
  char *pcVar8;
  iterator tree_it_00;
  TreeIterator tree_it;
  uint local_3c;
  TreeIterator local_38;
  LogMessageFatal local_28 [16];
  
  local_38.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
        *)0x0;
  local_38.position_ = -1;
  local_3c = b;
  bVar2 = revalidate_if_necessary(this,&local_3c,node,&local_38);
  if (!bVar2) {
    tree_it_00.position_ = local_38.position_;
    tree_it_00.node_ = local_38.node_;
    tree_it_00._12_4_ = 0;
    UntypedMapBase::EraseFromTree(&this->super_UntypedMapBase,local_3c,tree_it_00);
LAB_00160834:
    (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
    if (local_3c == (this->super_UntypedMapBase).index_of_first_non_null_) {
      uVar1 = (this->super_UntypedMapBase).num_buckets_;
      uVar6 = (this->super_UntypedMapBase).index_of_first_non_null_;
      if (uVar6 < uVar1) {
        pTVar4 = (this->super_UntypedMapBase).table_ + uVar6;
        do {
          uVar6 = uVar6 + 1;
          if (*pTVar4 != 0) {
            return;
          }
          (this->super_UntypedMapBase).index_of_first_non_null_ = uVar6;
          pTVar4 = pTVar4 + 1;
        } while (uVar6 != uVar1);
      }
    }
    return;
  }
  pNVar3 = (NodeBase *)(this->super_UntypedMapBase).table_[local_3c];
  if ((pNVar3 == (NodeBase *)0x0) || (((ulong)pNVar3 & 1) != 0)) {
    pcVar8 = "TableEntryIsNonEmptyList(b)";
    uVar5 = 0x1b;
    uVar7 = 0x3bc;
  }
  else {
    pNVar3 = EraseFromLinkedList(&node->super_NodeBase,pNVar3);
    if (((ulong)pNVar3 & 1) == 0) {
      (this->super_UntypedMapBase).table_[local_3c] = (TableEntryPtr)pNVar3;
      goto LAB_00160834;
    }
    pcVar8 = "(reinterpret_cast<uintptr_t>(node) & 1) == 0";
    uVar5 = 0x2c;
    uVar7 = 0x1ac;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map.h"
             ,uVar7,uVar5,pcVar8);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

PROTOBUF_NOINLINE void erase_no_destroy(map_index_t b, KeyNode* node) {
    TreeIterator tree_it;
    const bool is_list = revalidate_if_necessary(b, node, &tree_it);
    if (is_list) {
      ABSL_DCHECK(TableEntryIsNonEmptyList(b));
      auto* head = TableEntryToNode(table_[b]);
      head = EraseFromLinkedList(node, head);
      table_[b] = NodeToTableEntry(head);
    } else {
      EraseFromTree(b, tree_it);
    }
    --num_elements_;
    if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             TableEntryIsEmpty(index_of_first_non_null_)) {
        ++index_of_first_non_null_;
      }
    }
  }